

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.hpp
# Opt level: O3

Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 rc::shrinkable::
 filter<std::__cxx11::string,rapidCheck_propImpl_Bech32TestRC_stringsTooLongAreRejected()::__0_const&>
           (Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *shrinkable,anon_class_1_0_00000001_for_m_predicate *pred)

{
  _func_int **pp_Var1;
  Storage extraout_RAX;
  IShrinkableImpl *pIVar2;
  Storage extraout_RAX_00;
  Storage SVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  MVar5;
  Storage local_38;
  ulong local_30;
  long local_28 [2];
  
  (**(code **)**(undefined8 **)pred)(&local_38);
  SVar3 = (Storage)local_28;
  uVar4 = extraout_RDX;
  if (local_38 != SVar3) {
    operator_delete((void *)local_38,local_28[0] + 1);
    SVar3 = extraout_RAX;
    uVar4 = extraout_RDX_00;
  }
  if (local_30 < 0x5b) {
    *(undefined1 *)&shrinkable[1].m_impl = 0;
  }
  else {
    pp_Var1 = *(_func_int ***)pred;
    *(undefined8 *)pred = 0;
    pIVar2 = (IShrinkableImpl *)operator_new(0x20);
    pIVar2->_vptr_IShrinkableImpl = (_func_int **)&PTR_value_001b1000;
    pIVar2[2]._vptr_IShrinkableImpl = pp_Var1;
    pIVar2[3]._vptr_IShrinkableImpl = (_func_int **)0x1;
    *(undefined1 *)&shrinkable[1].m_impl = 0;
    Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((Maybe<rc::Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)shrinkable);
    shrinkable->m_impl = pIVar2;
    *(undefined1 *)&shrinkable[1].m_impl = 1;
    SVar3 = extraout_RAX_00;
    uVar4 = extraout_RDX_01;
  }
  MVar5._8_8_ = uVar4;
  MVar5.m_storage = SVar3;
  return MVar5;
}

Assistant:

Maybe<Shrinkable<T>> filter(Shrinkable<T> shrinkable, Predicate &&pred) {
  if (!pred(shrinkable.value())) {
    return Nothing;
  }

  return shrinkable::mapShrinks(
      std::move(shrinkable),
      [=](Seq<Shrinkable<T>> &&shrinks) {
        return seq::mapMaybe(std::move(shrinks),
                             [=](Shrinkable<T> &&shrink) {
                               return shrinkable::filter(std::move(shrink),
                                                         pred);
                             });
      });
}